

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

anm_instr_t * anm_serialize_instr(parser_state_t *state,thanm_instr_t *instr,anm_script_t *script)

{
  undefined4 *puVar1;
  byte bVar2;
  uint32_t uVar3;
  anm_instr_t *paVar4;
  label_t *plVar5;
  symbol_id_pair_t *psVar6;
  symbol_id_pair_t *symbol_1;
  symbol_id_pair_t *symbol;
  int32_t time;
  label_t *label_1;
  label_t *label;
  list_node_t *node;
  size_t offset;
  int i;
  thanm_param_t *param;
  anm_instr_t *raw;
  uint32_t size;
  anm_script_t *script_local;
  thanm_instr_t *instr_local;
  parser_state_t *state_local;
  
  uVar3 = instr_get_size(instr,8);
  paVar4 = (anm_instr_t *)util_malloc((ulong)uVar3);
  paVar4->type = instr->id;
  paVar4->length = (short)uVar3 - 8;
  paVar4->time = instr->time;
  paVar4->param_mask = 0;
  bVar2 = 0;
  node = (list_node_t *)0x0;
  for (label = (label_t *)(instr->params).head; label != (label_t *)0x0; label = *(label_t **)label)
  {
    puVar1 = *(undefined4 **)(label + 1);
    if (puVar1[1] != 0) {
      paVar4->param_mask = paVar4->param_mask | (ushort)(1 << (bVar2 & 0x1f));
    }
    switch(*puVar1) {
    case 0x4e:
      psVar6 = symbol_find(&state->script_names,*(char **)(*(long *)(puVar1 + 4) + 8));
      if (psVar6 == (symbol_id_pair_t *)0x0) {
        fprintf(_stderr,"%s: script not found: %s\n",argv0,
                *(undefined8 *)(*(long *)(puVar1 + 4) + 8));
      }
      else {
        *(uint32_t *)((long)&node->next + (long)&paVar4[1].type) = psVar6->id;
        node = (list_node_t *)((long)&node->next + 4);
      }
      break;
    case 0x53:
      *(undefined4 *)((long)&node->next + (long)&paVar4[1].type) =
           *(undefined4 *)(*(long *)(puVar1 + 4) + 8);
      node = (list_node_t *)((long)&node->next + 4);
      break;
    case 0x66:
      *(undefined4 *)((long)&node->next + (long)&paVar4[1].type) =
           *(undefined4 *)(*(long *)(puVar1 + 4) + 8);
      node = (list_node_t *)((long)&node->next + 4);
      break;
    case 0x6e:
      psVar6 = symbol_find(&state->sprite_names,*(char **)(*(long *)(puVar1 + 4) + 8));
      if (psVar6 == (symbol_id_pair_t *)0x0) {
        fprintf(_stderr,"%s: sprite not found: %s\n",argv0,
                *(undefined8 *)(*(long *)(puVar1 + 4) + 8));
      }
      else {
        *(uint32_t *)((long)&node->next + (long)&paVar4[1].type) = psVar6->id;
        node = (list_node_t *)((long)&node->next + 4);
      }
      break;
    case 0x6f:
      plVar5 = label_find(script,*(char **)(*(long *)(puVar1 + 4) + 8));
      if (plVar5 == (label_t *)0x0) {
        fprintf(_stderr,"%s: label not found: %s\n",argv0,*(undefined8 *)(*(long *)(puVar1 + 4) + 8)
               );
      }
      else {
        *(uint32_t *)((long)&node->next + (long)&paVar4[1].type) = plVar5->offset;
        node = (list_node_t *)((long)&node->next + 4);
      }
      break;
    case 0x73:
      *(undefined2 *)((long)&node->next + (long)&paVar4[1].type) =
           *(undefined2 *)(*(long *)(puVar1 + 4) + 8);
      node = (list_node_t *)((long)&node->next + 2);
      break;
    case 0x74:
      plVar5 = label_find(script,*(char **)(*(long *)(puVar1 + 4) + 8));
      if (plVar5 == (label_t *)0x0) {
        fprintf(_stderr,"%s: label not found: %s\n",argv0,*(undefined8 *)(*(long *)(puVar1 + 4) + 8)
               );
      }
      else {
        *(int *)((long)&node->next + (long)&paVar4[1].type) = (int)plVar5->time;
        node = (list_node_t *)((long)&node->next + 4);
      }
    }
    bVar2 = bVar2 + 1;
  }
  return paVar4;
}

Assistant:

static anm_instr_t*
anm_serialize_instr(
    parser_state_t* state,
    thanm_instr_t* instr,
    anm_script_t* script
) {
    /* The size field of an instruction refers to size in its vesion.
     * However, here we are always allocating an anm_instr_t...
     * So we need to get size it would get as if it was anm_instr_t, no matter what. */
    uint32_t size = instr_get_size(instr, 8);

    anm_instr_t* raw = (anm_instr_t*)util_malloc(size);
    raw->type = instr->id;
    raw->length = size - sizeof(anm_instr_t); /* size of parametes. */
    raw->time = instr->time;
    raw->param_mask = 0;
    thanm_param_t* param;
    int i = 0;
    size_t offset = 0;
    list_for_each(&instr->params, param) {
        /* Format checking was done by the parser, no need to do it here again. */
        if (param->is_var)
            raw->param_mask |= 1 << i;

        switch(param->type) {
            case 'S':
                memcpy(&raw->data[offset], &param->val->val.S, sizeof(int32_t));
                offset += sizeof(int32_t);
                break;
            case 's':
                memcpy(&raw->data[offset], &param->val->val.s, sizeof(int16_t));
                offset += sizeof(int16_t);
                break;
            case 'f':
                memcpy(&raw->data[offset], &param->val->val.f, sizeof(float));
                offset += sizeof(float);
                break;
            case 'o': {
                label_t* label = label_find(script, param->val->val.z);
                if (label == NULL) {
                    fprintf(stderr, "%s: label not found: %s\n", argv0, param->val->val.z);
                    break;
                }
                memcpy(&raw->data[offset], &label->offset, sizeof(int32_t));
                offset += sizeof(int32_t);
                break;
            }
            case 't': {
                label_t* label = label_find(script, param->val->val.z);
                if (label == NULL) {
                    fprintf(stderr, "%s: label not found: %s\n", argv0, param->val->val.z);
                    break;
                }
                int32_t time = label->time;
                memcpy(&raw->data[offset], &time, sizeof(int32_t));
                offset += sizeof(int32_t);
                break;
            }
            case 'n': {
                symbol_id_pair_t* symbol = symbol_find(&state->sprite_names, param->val->val.z);
                if (symbol == NULL) {
                    fprintf(stderr, "%s: sprite not found: %s\n", argv0, param->val->val.z);
                    break;
                }
                memcpy(&raw->data[offset], &symbol->id, sizeof(int32_t));
                offset += sizeof(int32_t);
                break;
            }
            case 'N': {
                symbol_id_pair_t* symbol = symbol_find(&state->script_names, param->val->val.z);
                if (symbol == NULL) {
                    fprintf(stderr, "%s: script not found: %s\n", argv0, param->val->val.z);
                    break;
                }
                memcpy(&raw->data[offset], &symbol->id, sizeof(int32_t));
                offset += sizeof(int32_t);
                break;
            }
        }
        ++i;
    }
    return raw;
}